

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_color nk_hsva(int h,int s,int v,int a)

{
  int iVar1;
  nk_color nVar2;
  nk_colorf nVar3;
  
  if (0xfe < h) {
    h = 0xff;
  }
  if (h < 1) {
    h = 0;
  }
  if (0xfe < s) {
    s = 0xff;
  }
  if (s < 1) {
    s = 0;
  }
  if (0xfe < v) {
    v = 0xff;
  }
  if (v < 1) {
    v = 0;
  }
  iVar1 = 0xff;
  if (a < 0xff) {
    iVar1 = a;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  nVar3 = nk_hsva_colorf((float)h / 255.0,(float)s / 255.0,(float)v / 255.0,(float)iVar1 / 255.0);
  nVar2 = nk_rgba_f(nVar3.r,nVar3.g,nVar3.b,nVar3.a);
  return nVar2;
}

Assistant:

NK_API struct nk_color
nk_hsva(int h, int s, int v, int a)
{
    float hf = ((float)NK_CLAMP(0, h, 255)) / 255.0f;
    float sf = ((float)NK_CLAMP(0, s, 255)) / 255.0f;
    float vf = ((float)NK_CLAMP(0, v, 255)) / 255.0f;
    float af = ((float)NK_CLAMP(0, a, 255)) / 255.0f;
    return nk_hsva_f(hf, sf, vf, af);
}